

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom32.cc
# Opt level: O0

void atom32_write_data(hwtest_ctx *ctx,uint32_t *src1,uint32_t *src2,uint32_t *src3)

{
  uint32_t uVar1;
  int local_2c;
  int i;
  uint32_t *src3_local;
  uint32_t *src2_local;
  uint32_t *src1_local;
  hwtest_ctx *ctx_local;
  
  nva_wr32(ctx->cnum,0x1700,0x200);
  for (local_2c = 0; local_2c < 0x200; local_2c = local_2c + 1) {
    nva_wr32(ctx->cnum,local_2c * 4 + 0x700000,src1[local_2c]);
    nva_wr32(ctx->cnum,local_2c * 4 + 0x700800,src2[local_2c]);
    nva_wr32(ctx->cnum,local_2c * 4 + 0x701000,src3[local_2c]);
  }
  nva_wr32(ctx->cnum,0x70000,1);
  do {
    uVar1 = nva_rd32(ctx->cnum,0x70000);
  } while (uVar1 != 0);
  return;
}

Assistant:

static void atom32_write_data(struct hwtest_ctx *ctx, const uint32_t *src1, const uint32_t *src2, const uint32_t *src3) {
	int i;
	nva_wr32(ctx->cnum, 0x1700, 0x200);
	for (i = 0; i < 0x200; i++) {
		nva_wr32(ctx->cnum, 0x700000 + i * 4, src1[i]);
		nva_wr32(ctx->cnum, 0x700800 + i * 4, src2[i]);
		nva_wr32(ctx->cnum, 0x701000 + i * 4, src3[i]);
	}
	nva_wr32(ctx->cnum, 0x70000, 1);
	while (nva_rd32(ctx->cnum, 0x70000));
}